

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O1

void createRandomTapes(randomTape_t *tapes,uint8_t *seeds,uint8_t *salt,size_t t,
                      picnic_instance_t *params)

{
  uint8_t **ppuVar1;
  uint capacity;
  ulong uVar2;
  uint rate;
  ulong uVar3;
  uint16_t data0_le;
  uint16_t data2_le;
  uint16_t data1_le;
  hash_context_x4 ctx;
  undefined2 local_3e8;
  short local_3e6;
  short local_3e4;
  short local_3e2;
  ulong local_3e0;
  uint8_t *local_3d8;
  short *psStack_3d0;
  short *psStack_3c8;
  short *psStack_3c0;
  randomTape_t *local_3b8;
  size_t local_3b0;
  undefined1 local_3a8 [32];
  undefined1 local_388 [32];
  Keccak_HashInstancetimes4 local_368;
  
  local_3e0 = (ulong)params->view_size;
  local_3b8 = tapes;
  local_3b0 = t;
  allocateRandomTape(tapes,params);
  if (params->num_MPC_parties != '\0') {
    local_3e0 = (ulong)(uint)((int)local_3e0 << 4);
    local_388 = vpbroadcastq_avx512vl();
    local_3a8 = vpbroadcastq_avx512vl();
    uVar3 = 0;
    do {
      if (params->digest_size == ' ') {
        rate = 0x540;
        capacity = 0x100;
      }
      else {
        rate = 0x440;
        capacity = 0x200;
      }
      Keccak_HashInitializetimes4(&local_368,rate,capacity,0,'\x1f');
      uVar2 = (ulong)params->seed_size;
      local_3d8 = seeds + uVar3 * uVar2;
      psStack_3d0 = (short *)(seeds + (uVar3 + 1) * uVar2);
      psStack_3c8 = (short *)(seeds + (uVar3 + 2) * uVar2);
      psStack_3c0 = (short *)(seeds + (uVar3 + 3) * uVar2);
      Keccak_HashUpdatetimes4(&local_368,&local_3d8,(ulong)params->seed_size << 3);
      local_3d8 = (uint8_t *)local_388._0_8_;
      psStack_3d0 = (short *)local_388._8_8_;
      psStack_3c8 = (short *)local_388._16_8_;
      psStack_3c0 = (short *)local_388._24_8_;
      Keccak_HashUpdatetimes4(&local_368,&local_3d8,0x100);
      local_3e8 = (undefined2)local_3b0;
      local_3d8 = (uint8_t *)local_3a8._0_8_;
      psStack_3d0 = (short *)local_3a8._8_8_;
      psStack_3c8 = (short *)local_3a8._16_8_;
      psStack_3c0 = (short *)local_3a8._24_8_;
      Keccak_HashUpdatetimes4(&local_368,&local_3d8,0x10);
      local_3e8 = (undefined2)uVar3;
      local_3e2 = (short)(uVar3 + 1);
      local_3e4 = local_3e2 + 1;
      local_3e6 = local_3e2 + 2;
      psStack_3d0 = &local_3e2;
      psStack_3c8 = &local_3e4;
      psStack_3c0 = &local_3e6;
      local_3d8 = (uint8_t *)&local_3e8;
      Keccak_HashUpdatetimes4(&local_368,&local_3d8,0x10);
      Keccak_HashFinaltimes4(&local_368,(BitSequence **)0x0);
      ppuVar1 = local_3b8->tape + uVar3;
      local_3d8 = *ppuVar1;
      psStack_3d0 = (short *)ppuVar1[1];
      psStack_3c8 = (short *)ppuVar1[2];
      psStack_3c0 = (short *)ppuVar1[3];
      Keccak_HashSqueezetimes4(&local_368,&local_3d8,local_3e0);
      uVar3 = uVar3 + 4;
    } while (uVar3 < params->num_MPC_parties);
  }
  return;
}

Assistant:

static void createRandomTapes(randomTape_t* tapes, uint8_t* seeds, uint8_t* salt, size_t t,
                              const picnic_instance_t* params) {
  hash_context_x4 ctx;

  size_t tapeSizeBytes = 2 * params->view_size;

  allocateRandomTape(tapes, params);
  assert(params->num_MPC_parties % 4 == 0);
  for (size_t i = 0; i < params->num_MPC_parties; i += 4) {
    hash_init_x4(&ctx, params->digest_size);

    hash_update_x4_4(&ctx, &seeds[i * params->seed_size], &seeds[(i + 1) * params->seed_size],
                     &seeds[(i + 2) * params->seed_size], &seeds[(i + 3) * params->seed_size],
                     params->seed_size);
    hash_update_x4_1(&ctx, salt, SALT_SIZE);
    hash_update_x4_uint16_le(&ctx, t);
    const uint16_t i_arr[4] = {i + 0, i + 1, i + 2, i + 3};
    hash_update_x4_uint16s_le(&ctx, i_arr);
    hash_final_x4(&ctx);

    hash_squeeze_x4_4(&ctx, tapes->tape[i], tapes->tape[i + 1], tapes->tape[i + 2],
                      tapes->tape[i + 3], tapeSizeBytes);
    hash_clear_x4(&ctx);
  }
}